

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::PatternMatcher::match(PatternMatcher *this,Name funcName)

{
  bool bVar1;
  size_type sVar2;
  reference pattern_00;
  string local_68;
  reference local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pattern;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  PatternMatcher *this_local;
  Name funcName_local;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  this_local = funcName.super_IString.str._M_len;
  sVar2 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                    (&this->names,(key_type *)&this_local);
  if (sVar2 == 0) {
    __end3 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->patterns);
    pattern = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->patterns);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&pattern), bVar1) {
      pattern_00 = std::
                   _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end3);
      local_48 = pattern_00;
      IString::toString_abi_cxx11_(&local_68,(IString *)&this_local);
      bVar1 = String::wildcardMatch(pattern_00,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (bVar1) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&this->patternsMatched,local_48);
        return true;
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    funcName_local.super_IString.str._M_str._7_1_ = false;
  }
  else {
    funcName_local.super_IString.str._M_str._7_1_ = true;
  }
  return funcName_local.super_IString.str._M_str._7_1_;
}

Assistant:

bool match(Name funcName) {
    if (names.count(funcName) > 0) {
      return true;
    } else {
      for (auto& pattern : patterns) {
        if (String::wildcardMatch(pattern, funcName.toString())) {
          patternsMatched.insert(pattern);
          return true;
        }
      }
    }
    return false;
  }